

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodeltester.cpp
# Opt level: O3

void __thiscall
QAbstractItemModelTesterPrivate::layoutChanged(QAbstractItemModelTesterPrivate *this)

{
  Data *pDVar1;
  bool bVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pQVar5;
  long lVar6;
  ulong uVar7;
  long in_FS_OFFSET;
  QPersistentModelIndex p;
  QObject *local_a0;
  QModelIndex local_88;
  undefined1 local_70 [24];
  QModelIndex local_58;
  QPersistentModelIndex local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.r = 4;
  bVar2 = compare<QAbstractItemModelTesterPrivate::ChangeInFlight,QAbstractItemModelTesterPrivate::ChangeInFlight>
                    (this,&this->changeInFlight,(ChangeInFlight *)&local_58,"changeInFlight",
                     "ChangeInFlight::LayoutChanged",
                     "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                     ,0x393);
  if (bVar2) {
    this->changeInFlight = None;
    if ((this->changing).d.size != 0) {
      lVar6 = 0;
      uVar7 = 0;
      do {
        local_40.d = (QPersistentModelIndexData *)&DAT_aaaaaaaaaaaaaaaa;
        pQVar5 = QList<QPersistentModelIndex>::data(&this->changing);
        QPersistentModelIndex::QPersistentModelIndex
                  (&local_40,(QPersistentModelIndex *)((long)&pQVar5->d + lVar6));
        pDVar1 = (this->model).wp.d;
        if ((pDVar1 == (Data *)0x0) ||
           ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
          local_a0 = (QObject *)0x0;
        }
        else {
          local_a0 = (this->model).wp.value;
        }
        uVar3 = QPersistentModelIndex::row();
        uVar4 = QPersistentModelIndex::column();
        QPersistentModelIndex::parent();
        (**(code **)(*(long *)local_a0 + 0x60))(&local_58,local_a0,uVar3,uVar4,local_70);
        QPersistentModelIndex::operator_cast_to_QModelIndex(&local_88,&local_40);
        bVar2 = compare<QModelIndex,QModelIndex>
                          (this,&local_58,&local_88,"model->index(p.row(), p.column(), p.parent())",
                           "QModelIndex(p)",
                           "/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/testlib/qabstractitemmodeltester.cpp"
                           ,0x398);
        QPersistentModelIndex::~QPersistentModelIndex(&local_40);
        if (!bVar2) goto LAB_0014b326;
        uVar7 = uVar7 + 1;
        lVar6 = lVar6 + 8;
      } while (uVar7 < (ulong)(this->changing).d.size);
    }
    QList<QPersistentModelIndex>::clear(&this->changing);
  }
LAB_0014b326:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemModelTesterPrivate::layoutChanged()
{
    MODELTESTER_COMPARE(changeInFlight, ChangeInFlight::LayoutChanged);
    changeInFlight = ChangeInFlight::None;

    for (int i = 0; i < changing.size(); ++i) {
        QPersistentModelIndex p = changing[i];
        MODELTESTER_COMPARE(model->index(p.row(), p.column(), p.parent()), QModelIndex(p));
    }
    changing.clear();
}